

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_float_field
          (OneofWellKnownTypes *this,FloatValue *float_field)

{
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  clear_oneof_field(this);
  if (float_field != (FloatValue *)0x0) {
    submessage_arena =
         (Arena *)(float_field->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      float_field = (FloatValue *)
                    google::protobuf::internal::GetOwnedMessageInternal
                              (message_arena,(MessageLite *)float_field,submessage_arena);
    }
    (this->field_0)._impl_._oneof_case_[0] = 0xb;
    (this->field_0)._impl_.oneof_field_.any_field_ = &float_field->super_Message;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_float_field(::google::protobuf::FloatValue* PROTOBUF_NULLABLE float_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (float_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(float_field)->GetArena();
    if (message_arena != submessage_arena) {
      float_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, float_field, submessage_arena);
    }
    set_has_float_field();
    _impl_.oneof_field_.float_field_ = float_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.float_field)
}